

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

bool __thiscall HighsSparseMatrix::operator==(HighsSparseMatrix *this,HighsSparseMatrix *matrix)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined4 unaff_R12D;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  
  uVar1 = this->format_;
  uVar3 = this->num_col_;
  uVar2 = matrix->format_;
  uVar4 = matrix->num_col_;
  auVar11._4_4_ = -(uint)(uVar2 == uVar1);
  auVar11._0_4_ = -(uint)(uVar2 == uVar1);
  auVar11._8_4_ = -(uint)(uVar4 == uVar3);
  auVar11._12_4_ = -(uint)(uVar4 == uVar3);
  uVar10 = movmskpd(unaff_R12D,auVar11);
  iVar5 = matrix->num_row_;
  iVar6 = this->num_row_;
  bVar7 = std::operator==(&this->start_,&matrix->start_);
  bVar8 = std::operator==(&this->index_,&matrix->index_);
  bVar9 = std::operator==(&this->value_,&matrix->value_);
  return (bool)(((bVar9 && (bVar8 && bVar7)) && iVar6 == iVar5) & (byte)uVar10 &
               ((byte)uVar10 & 2) >> 1);
}

Assistant:

bool HighsSparseMatrix::operator==(const HighsSparseMatrix& matrix) const {
  bool equal = true;
  equal = this->format_ == matrix.format_ && equal;
  equal = this->num_col_ == matrix.num_col_ && equal;
  equal = this->num_row_ == matrix.num_row_ && equal;
  equal = this->start_ == matrix.start_ && equal;
  equal = this->index_ == matrix.index_ && equal;
  equal = this->value_ == matrix.value_ && equal;
  return equal;
}